

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O2

Constraint *
create_xmlNode_has_attribute_equal_to(xmlChar *attr,xmlChar *value,char *expected_value_name)

{
  Constraint *pCVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 local_40;
  anon_union_8_4_d526cc82_for_value aStack_38;
  size_t local_30;
  
  pCVar1 = (Constraint *)create_constraint();
  if (pCVar1 != (Constraint *)0x0) {
    puVar2 = (undefined8 *)malloc(0x10);
    if (puVar2 != (undefined8 *)0x0) {
      uVar3 = xmlStrdup(attr);
      *puVar2 = uVar3;
      uVar3 = xmlStrdup(value);
      puVar2[1] = uVar3;
      make_cgreen_pointer_value(&local_40,puVar2);
      (pCVar1->expected_value).value_size = local_30;
      *(undefined8 *)&pCVar1->expected_value = local_40;
      (pCVar1->expected_value).value = aStack_38;
      pcVar4 = strdup(expected_value_name);
      pCVar1->expected_value_name = pcVar4;
      pCVar1->type = CGREEN_STRING_COMPARER_CONSTRAINT;
      pCVar1->compare = compare_xmlNode_has_attribute_equal_to;
      pCVar1->failure_message = failure_message_xmlNode_has_attribute_equal_to;
      pCVar1->name = "have attribute with value";
      pCVar1->size_of_expected_value = 8;
      pCVar1->destroy = destroy_xmlNode_has_attribute_equal_to;
      return pCVar1;
    }
    (*pCVar1->destroy)(pCVar1);
  }
  return (Constraint *)0x0;
}

Assistant:

static Constraint *create_xmlNode_has_attribute_equal_to(const xmlChar* attr,
                                                         const xmlChar *value,
                                                         const char* expected_value_name)
{
    Constraint *constraint = create_constraint();
    if (!constraint)
        return NULL;

    struct xmlNode_has_attribute_equal_to *expected =
        (struct xmlNode_has_attribute_equal_to *)malloc(sizeof(struct xmlNode_has_attribute_equal_to));
    if (!expected) {
        constraint->destroy(constraint);
        return NULL;
    }

    expected->attr = xmlStrdup(attr);
    expected->value = xmlStrdup(value);

    constraint->expected_value = make_cgreen_pointer_value(expected);
    constraint->expected_value_name = strdup(expected_value_name);
    constraint->type = CGREEN_STRING_COMPARER_CONSTRAINT;

    constraint->compare = &compare_xmlNode_has_attribute_equal_to;
    constraint->failure_message = &failure_message_xmlNode_has_attribute_equal_to;
    constraint->name = "have attribute with value";
    constraint->size_of_expected_value = sizeof(intptr_t);
    constraint->destroy = &destroy_xmlNode_has_attribute_equal_to;

    return constraint;
}